

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O1

int __thiscall MSH::mesh_file::scan_Elements(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  char cVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  element input_ele;
  int local_100;
  int local_fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  ulong local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  pointer local_b8;
  pointer local_b0;
  pointer local_a0;
  element local_98;
  _Rb_tree<int,std::pair<int_const,MSH::element>,std::_Select1st<std::pair<int_const,MSH::element>>,std::less<int>,std::allocator<std::pair<int_const,MSH::element>>>
  *local_60;
  fstream *local_58;
  string *local_50;
  anon_union_16_2_ba345be5_for_m_Storage local_48;
  ulong local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)line_buffer);
  if (iVar2 != 0) {
    local_60 = (_Rb_tree<int,std::pair<int_const,MSH::element>,std::_Select1st<std::pair<int_const,MSH::element>>,std::less<int>,std::allocator<std::pair<int_const,MSH::element>>>
                *)&this->elements_map;
    local_58 = mesh_file;
    local_50 = line_buffer;
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)mesh_file + -0x18) + (char)mesh_file);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)mesh_file,(string *)line_buffer,cVar1);
      local_d8._0_8_ = "\r";
      local_d8._8_8_ = "";
      pcVar9 = (line_buffer->_M_dataplus)._M_p;
      sVar3 = line_buffer->_M_string_length;
      pcVar8 = pcVar9 + sVar3;
      for (; pcVar10 = pcVar8, sVar3 != 0; sVar3 = sVar3 - 1) {
        if (*pcVar9 == '\r') {
          pcVar8 = pcVar9 + 1;
          pcVar10 = pcVar9;
          break;
        }
        pcVar9 = pcVar9 + 1;
      }
      if (pcVar10 != pcVar8) {
        boost::algorithm::detail::
        find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                  (line_buffer);
      }
      iVar2 = std::__cxx11::string::compare((char *)line_buffer);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = check_read_state(mesh_file);
      if (iVar2 != 0) {
        return 1;
      }
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8._0_8_ = " ";
      local_d8._8_8_ = "";
      boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
                ((is_any_ofF<char> *)&local_48,(iterator_range<const_char_*> *)local_d8);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                (&local_f8,line_buffer,(is_any_ofF<char> *)&local_48,token_compress_off);
      if ((0x10 < local_38) && (local_48.m_dynSet != (set_value_type *)0x0)) {
        operator_delete__(local_48.m_dynSet);
      }
      local_e0 = (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (5 < local_e0) {
        local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (int *)0x0;
        local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (int *)0x0;
        local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        pcVar8 = ((local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol(pcVar8,(char **)local_d8,10);
        if ((char *)local_d8._0_8_ == pcVar8) goto LAB_0013fd12;
        if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
          if (*piVar4 == 0) {
            *piVar4 = iVar2;
          }
          local_fc = (int)lVar5;
          pcVar8 = local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          iVar2 = *piVar4;
          *piVar4 = 0;
          lVar5 = strtol(pcVar8,(char **)local_d8,10);
          if ((char *)local_d8._0_8_ != pcVar8) {
            if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
              if (*piVar4 == 0) {
                *piVar4 = iVar2;
              }
              local_98.type = (int)lVar5;
              pcVar8 = local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
              iVar2 = *piVar4;
              *piVar4 = 0;
              lVar5 = strtol(pcVar8,(char **)local_d8,10);
              if ((char *)local_d8._0_8_ != pcVar8) {
                if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar4 != 0x22)) {
                  if (*piVar4 == 0) {
                    *piVar4 = iVar2;
                  }
                  if ((int)lVar5 < 1) {
                    uVar13 = 3;
                  }
                  else {
                    uVar11 = (int)lVar5 + 2;
                    if ((int)uVar11 < 4) {
                      uVar11 = 3;
                    }
                    lVar5 = 0x60;
                    lVar12 = -3;
                    do {
                      pcVar8 = *(char **)((long)&((local_f8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar5);
                      iVar2 = *piVar4;
                      *piVar4 = 0;
                      lVar6 = strtol(pcVar8,(char **)local_d8,10);
                      if ((char *)local_d8._0_8_ == pcVar8) {
                        std::__throw_invalid_argument("stoi");
LAB_0013fcb2:
                        std::__throw_out_of_range("stoi");
                        goto LAB_0013fcbe;
                      }
                      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22))
                      goto LAB_0013fcb2;
                      if (*piVar4 == 0) {
                        *piVar4 = iVar2;
                      }
                      local_100 = (int)lVar6;
                      if (local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_98.tags,
                                   (iterator)
                                   local_98.tags.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_100);
                      }
                      else {
                        *local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_100;
                        local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      lVar5 = lVar5 + 0x20;
                      lVar6 = lVar12 + (ulong)uVar11;
                      lVar12 = lVar12 + -1;
                    } while (lVar6 != 0);
                    uVar13 = -lVar12;
                  }
                  if (uVar13 < local_e0) {
                    lVar5 = uVar13 << 5;
                    do {
                      pcVar8 = *(char **)((long)&((local_f8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar5);
                      iVar2 = *piVar4;
                      *piVar4 = 0;
                      lVar12 = strtol(pcVar8,(char **)local_d8,10);
                      if ((char *)local_d8._0_8_ == pcVar8) goto LAB_0013fcbe;
                      if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22))
                      goto LAB_0013fcca;
                      if (*piVar4 == 0) {
                        *piVar4 = iVar2;
                      }
                      local_100 = (int)lVar12;
                      if (local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (&local_98.node_vect,
                                   (iterator)
                                   local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_100);
                      }
                      else {
                        *local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_100;
                        local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                      uVar13 = uVar13 + 1;
                      lVar5 = lVar5 + 0x20;
                    } while (uVar13 < local_e0);
                  }
                  std::pair<const_int,_MSH::element>::pair<int_&,_MSH::element_&,_true>
                            ((pair<const_int,_MSH::element> *)local_d8,&local_fc,&local_98);
                  std::
                  _Rb_tree<int,std::pair<int_const,MSH::element>,std::_Select1st<std::pair<int_const,MSH::element>>,std::less<int>,std::allocator<std::pair<int_const,MSH::element>>>
                  ::_M_insert_unique<std::pair<int_const,MSH::element>>
                            (local_60,(pair<const_int,_MSH::element> *)local_d8);
                  line_buffer = local_50;
                  mesh_file = local_58;
                  if (local_b0 != (pointer)0x0) {
                    operator_delete(local_b0,(long)local_a0 - (long)local_b0);
                  }
                  if (local_c8 != (pointer)0x0) {
                    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
                  }
                  if (local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_98.node_vect.super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_98.node_vect.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_98.node_vect.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_98.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_98.tags.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_98.tags.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_98.tags.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  goto LAB_0013fc6c;
                }
                goto LAB_0013fcd6;
              }
              goto LAB_0013fce2;
            }
            goto LAB_0013fcee;
          }
          goto LAB_0013fcfa;
        }
        goto LAB_0013fd06;
      }
LAB_0013fc6c:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      iVar2 = std::__cxx11::string::compare((char *)line_buffer);
    } while (iVar2 != 0);
  }
  return 0;
LAB_0013fcbe:
  std::__throw_invalid_argument("stoi");
LAB_0013fcca:
  std::__throw_out_of_range("stoi");
LAB_0013fcd6:
  std::__throw_out_of_range("stoi");
LAB_0013fce2:
  std::__throw_invalid_argument("stoi");
LAB_0013fcee:
  std::__throw_out_of_range("stoi");
LAB_0013fcfa:
  std::__throw_invalid_argument("stoi");
LAB_0013fd06:
  std::__throw_out_of_range("stoi");
LAB_0013fd12:
  uVar7 = std::__throw_invalid_argument("stoi");
  std::pair<const_int,_MSH::element>::~pair((pair<const_int,_MSH::element> *)local_d8);
  element::~element(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  _Unwind_Resume(uVar7);
}

Assistant:

int MSH::mesh_file::scan_Elements(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="$EndElements")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndElements")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        auto element_size = split_str_vec.size();
        if (element_size>5)
        {
            element input_ele;
            int counter = 0;
            int index = std::stoi(split_str_vec[counter++]);
            input_ele.type = std::stoi(split_str_vec[counter++]);
            int tag_count = std::stoi(split_str_vec[counter++]);
            auto first_end = counter+tag_count;
            for (auto i = counter; i < first_end; i++)
            {
                input_ele.tags.push_back(std::stoi(split_str_vec[counter]));
                counter++;
            }
            for (auto j = counter; j < element_size; j++)
            {
                input_ele.node_vect.push_back(std::stoi(split_str_vec[j]));
            }
            elements_map.insert({index, input_ele});
        }
    }
    return EXIT_SUCCESS;
}